

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

void __thiscall despot::POMCPPrior::POMCPPrior(POMCPPrior *this,DSPOMDP *model)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  DSPOMDP *model_local;
  POMCPPrior *this_local;
  
  this->_vptr_POMCPPrior = (_func_int **)&PTR__POMCPPrior_0026f048;
  this->model_ = model;
  History::History(&this->history_);
  std::vector<int,_std::allocator<int>_>::vector(&this->preferred_actions_);
  std::vector<int,_std::allocator<int>_>::vector(&this->legal_actions_);
  (*model->_vptr_DSPOMDP[10])();
  (*model->_vptr_DSPOMDP[0xb])();
  this->exploration_constant_ = extraout_XMM0_Qa - extraout_XMM0_Qa_00;
  return;
}

Assistant:

POMCPPrior::POMCPPrior(const DSPOMDP* model) :
	model_(model) {
	exploration_constant_ = (model->GetMaxReward()
		- model->GetBestAction().value);
}